

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioWaveChain(char *buf,uint bufSize)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  uint in_ESI;
  long in_RDI;
  int stk_lev;
  int stk_pos [10];
  uint32_t *endPtr;
  uint32_t next;
  uint32_t repeat;
  uint delayLeft;
  uint dcb;
  uint delayCBs;
  uint cycles;
  int counters;
  int loop;
  int cmd;
  int wid;
  int i;
  rawCbs_t *p;
  int chaincb;
  int cb;
  uint blocks;
  uint blklen;
  undefined4 in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  uint uVar6;
  uint32_t *dmaAddr;
  undefined8 in_stack_fffffffffffffec0;
  FILE *pFVar7;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffef0;
  uint local_9c;
  uint auStack_98 [12];
  uint32_t *local_68;
  uint32_t local_5c;
  uint32_t local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  rawCbs_t *local_30;
  int local_24;
  uint local_20;
  undefined4 local_1c;
  undefined4 local_18;
  uint local_14;
  long local_10;
  int local_4;
  
  pFVar7 = _stderr;
  iVar2 = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  uVar6 = (uint)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_18 = 0x10;
  local_1c = 4;
  local_9c = 0;
  local_20 = 0;
  local_40 = 0xffffffff;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar4 = myTimeStamp();
    uVar1 = local_14;
    pcVar5 = myBuf2Str(uVar6,(char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    fprintf(pFVar7,"%s %s: bufSize=%d [%s]\n",pcVar4,"gpioWaveChain",(ulong)uVar1,pcVar5);
  }
  pFVar7 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar4 = myTimeStamp();
      fprintf(pFVar7,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar4,"gpioWaveChain");
    }
    local_4 = -0x1f;
  }
  else {
    if (waveClockInited == 0) {
      stopHardwarePWM();
      initClock(iVar2);
      waveClockInited = 1;
      PWMClockInited = 0;
    }
    uVar6 = local_20;
    *dmaOut = 0x80000000;
    dmaOut[1] = 0;
    waveEndPtr = (uint32_t *)0x0;
    local_68 = (uint32_t *)0x0;
    local_20 = local_20 + 1;
    iVar2 = chainGetCB(uVar6);
    local_30 = rawWaveCBAdr(iVar2);
    if (gpioCfg.clockPeriph == 1) {
      local_30->info = 0x4050048;
      local_30->dst = pi_peri_phys + 0x20c018 & 0xffffff | 0x7e000000;
    }
    else {
      local_30->info = 0x4020048;
      local_30->dst = pi_peri_phys + 0x203004 & 0xffffff | 0x7e000000;
    }
    local_30->src = (int)*dmaOBus + 0xffc;
    local_30->length = 0x50;
    iVar2 = chainGetCB(local_20);
    uVar3 = waveCbPOadr(iVar2);
    local_30->next = uVar3;
    local_44 = 0;
    local_38 = 0xffffffff;
    local_34 = 0;
    while (uVar6 = local_20, pFVar7 = _stderr, local_34 < local_14) {
      local_38 = (uint)*(char *)(local_10 + (int)local_34);
      if (local_38 == 0xff) {
        if (local_14 < local_34 + 2) {
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar4 = myTimeStamp();
            fprintf(pFVar7,"%s %s: incomplete chain command (at %d)\n",pcVar4,"gpioWaveChain",
                    (ulong)local_34);
          }
          return -0x74;
        }
        local_3c = (uint)*(char *)(local_10 + (int)(local_34 + 1));
        if (local_3c == 0) {
          if (9 < local_9c) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: chain counters nested too deep (at %d)\n",pcVar4,
                      "gpioWaveChain",(ulong)local_34);
            }
            return -0x76;
          }
          auStack_98[(int)local_9c] = local_20;
          local_34 = local_34 + 2;
          local_9c = local_9c + 1;
        }
        else if (local_3c == 1) {
          if (0x13 < local_44) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: too many chain counters (at %d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_34);
            }
            return -0x73;
          }
          if (local_14 < local_34 + 4) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: incomplete chain command (at %d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_34);
            }
            return -0x74;
          }
          local_40 = 0;
          local_9c = local_9c - 1;
          if (-1 < (int)local_9c) {
            local_40 = auStack_98[(int)local_9c];
          }
          if (((int)local_40 < 1) || (local_40 == local_20)) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: empty chain loop (at %d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_34);
            }
            return -0x72;
          }
          local_48 = *(char *)(local_10 + (int)(local_34 + 3)) * 0x100 +
                     (int)*(char *)(local_10 + (int)(local_34 + 2));
          local_34 = local_34 + 4;
          if (0xffff < local_48) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: bad chain loop count (%d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_48);
            }
            return -0x71;
          }
          if (local_48 == 0) {
            iVar2 = chainGetCB(local_40);
            local_30 = rawWaveCBAdr(iVar2);
            iVar2 = chainGetCB(local_20);
            uVar3 = waveCbPOadr(iVar2);
            local_30->next = uVar3;
          }
          else if (local_48 != 1) {
            local_20 = local_20 + 1;
            local_24 = chainGetCB(uVar6);
            pFVar7 = _stderr;
            if (local_24 < 0) {
              if ((gpioCfg.internals & 0x400) == 0) {
                pcVar4 = myTimeStamp();
                fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",
                        (ulong)local_20);
              }
              return -0x77;
            }
            local_30 = rawWaveCBAdr(local_24);
            iVar2 = chainGetCB(local_40);
            local_58 = waveCbPOadr(iVar2);
            local_24 = chainGetCB(local_20);
            pFVar7 = _stderr;
            if (local_24 < 0) {
              if ((gpioCfg.internals & 0x400) == 0) {
                pcVar4 = myTimeStamp();
                fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",
                        (ulong)local_20);
              }
              return -0x77;
            }
            iVar2 = chainGetCB(local_20);
            local_5c = waveCbPOadr(iVar2);
            local_30->info = 0x4000008;
            local_30->src = (int)*dmaOBus + 0xffc;
            local_30->dst = (int)*dmaOBus + 0xffc;
            local_30->length = 4;
            iVar2 = chainGetCntCB(local_44);
            uVar3 = waveCbPOadr(iVar2);
            local_30->next = uVar3;
            chainMakeCounter((uint)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                             (uint)in_stack_fffffffffffffed0,
                             (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                             (uint)in_stack_fffffffffffffec8,
                             (uint32_t)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffec0);
            local_44 = local_44 + 1;
          }
        }
        else if (local_3c == 2) {
          if (local_14 < local_34 + 4) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: incomplete chain command (at %d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_34);
            }
            return -0x74;
          }
          local_48 = *(char *)(local_10 + (int)(local_34 + 3)) * 0x100 +
                     (int)*(char *)(local_10 + (int)(local_34 + 2));
          local_34 = local_34 + 4;
          if (0xffff < local_48) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: bad chain delay micros (%d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_48);
            }
            return -0x75;
          }
          if (local_48 != 0) {
            local_54 = local_48;
            local_4c = waveDelayCBs(local_48);
            for (local_50 = 0; uVar6 = local_20, local_50 < local_4c; local_50 = local_50 + 1) {
              local_20 = local_20 + 1;
              local_24 = chainGetCB(uVar6);
              if (local_24 < 0) {
                if ((gpioCfg.internals & 0x400) == 0) {
                  pFVar7 = _stderr;
                  pcVar4 = myTimeStamp();
                  fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",
                          (ulong)local_20);
                }
                return -0x77;
              }
              local_30 = rawWaveCBAdr(local_24);
              if (gpioCfg.clockPeriph == 1) {
                local_30->info = 0x4050048;
                local_30->dst = pi_peri_phys + 0x20c018 & 0xffffff | 0x7e000000;
              }
              else {
                local_30->info = 0x4020048;
                local_30->dst = pi_peri_phys + 0x203004 & 0xffffff | 0x7e000000;
              }
              local_30->src = (int)*dmaOBus + 0xffc;
              local_30->length = local_54 << 2;
              if ((6 < gpioCfg.DMAsecondaryChannel) && (0xfffc < local_30->length)) {
                local_30->length = 0xfffc;
              }
              local_54 = local_54 - (local_30->length >> 2);
              iVar2 = chainGetCB(local_20);
              uVar3 = waveCbPOadr(iVar2);
              local_30->next = uVar3;
            }
          }
        }
        else {
          if (local_3c != 3) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: unknown chain command (255 %d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_3c);
            }
            return -0x74;
          }
          local_34 = local_34 + 2;
          local_40 = 0;
          local_9c = local_9c - 1;
          if (-1 < (int)local_9c) {
            local_40 = auStack_98[(int)local_9c];
          }
          if (((int)local_40 < 1) || (local_40 == local_20)) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: empty chain loop (at %d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_34);
            }
            return -0x72;
          }
          local_20 = local_20 + 1;
          local_24 = chainGetCB(uVar6);
          pFVar7 = _stderr;
          if (local_24 < 0) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",
                      (ulong)local_20);
            }
            return -0x77;
          }
          if (local_34 < local_14) {
            if ((gpioCfg.internals & 0x400) == 0) {
              pcVar4 = myTimeStamp();
              fprintf(pFVar7,"%s %s: loop forever must be last command\n",pcVar4,"gpioWaveChain");
            }
            return -0x7c;
          }
          local_30 = rawWaveCBAdr(local_24);
          local_30->info = 0x4000008;
          local_30->src = (int)*dmaOBus + 0xffc;
          local_30->dst = (int)*dmaOBus + 0xffc;
          local_30->length = 4;
          iVar2 = chainGetCB(local_40);
          uVar3 = waveCbPOadr(iVar2);
          local_30->next = uVar3;
          local_68 = &local_30->next;
        }
      }
      else {
        if ((waveOutCount <= (int)local_38) || (waveInfo[(int)local_38].deleted != 0)) {
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar4 = myTimeStamp();
            fprintf(pFVar7,"%s %s: undefined wave (%d)\n",pcVar4,"gpioWaveChain",(ulong)local_38);
          }
          return -0x42;
        }
        local_20 = local_20 + 1;
        local_24 = chainGetCB(uVar6);
        if (local_24 < 0) {
          if ((gpioCfg.internals & 0x400) == 0) {
            pFVar7 = _stderr;
            pcVar4 = myTimeStamp();
            fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",(ulong)local_20)
            ;
          }
          return -0x77;
        }
        local_30 = rawWaveCBAdr(local_24);
        local_24 = chainGetCB(local_20);
        pFVar7 = _stderr;
        if (local_24 < 0) {
          if ((gpioCfg.internals & 0x400) == 0) {
            pcVar4 = myTimeStamp();
            fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",(ulong)local_20)
            ;
          }
          return -0x77;
        }
        iVar2 = local_20 - 1;
        uVar3 = waveCbPOadr(local_24);
        chainSetVal(iVar2,uVar3);
        local_30->info = 0x4000008;
        uVar3 = chainGetValPadr(local_20 - 1);
        local_30->src = uVar3;
        uVar3 = waveCbPOadr((uint)waveInfo[(int)local_38].topCB);
        local_30->dst = uVar3 + 0x14;
        local_30->length = 4;
        uVar3 = waveCbPOadr(waveInfo[(int)local_38].botCB + 1);
        local_30->next = uVar3;
        local_34 = local_34 + 1;
      }
    }
    local_20 = local_20 + 1;
    local_24 = chainGetCB(uVar6);
    pFVar7 = _stderr;
    if (local_24 < 0) {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar4 = myTimeStamp();
        fprintf(pFVar7,"%s %s: chain is too long (%d)\n",pcVar4,"gpioWaveChain",(ulong)local_20);
      }
      local_4 = -0x77;
    }
    else {
      local_30 = rawWaveCBAdr(local_24);
      local_30->info = 0x4000008;
      local_30->src = (int)*dmaOBus + 0xffc;
      local_30->dst = (int)*dmaOBus + 0xffc;
      local_30->length = 4;
      local_30->next = 0;
      if (local_68 == (uint32_t *)0x0) {
        local_68 = &local_30->next;
      }
      dmaAddr = dmaOut;
      iVar2 = chainGetCB(0);
      waveCbPOadr(iVar2);
      initDMAgo(dmaAddr,in_stack_fffffffffffffe9c);
      waveEndPtr = local_68;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int gpioWaveChain(char *buf, unsigned bufSize)
{
   unsigned blklen=16, blocks=4;
   int cb, chaincb;
   rawCbs_t *p;
   int i, wid, cmd, loop, counters;
   unsigned cycles, delayCBs, dcb, delayLeft;
   uint32_t repeat, next, *endPtr;
   int stk_pos[10], stk_lev=0;

   cb = 0;
   loop = -1;

   DBG(DBG_USER, "bufSize=%d [%s]", bufSize, myBuf2Str(bufSize, buf));

   CHECK_INITED;

   if (!waveClockInited)
   {
      stopHardwarePWM();
      initClock(0); /* initialise secondary clock */
      waveClockInited = 1;
      PWMClockInited = 0;
   }

   dmaOut[DMA_CS] = DMA_CHANNEL_RESET;
   dmaOut[DMA_CONBLK_AD] = 0;
   waveEndPtr = NULL;
   endPtr = NULL;

   /* add delay cb at start of DMA */

   p = rawWaveCBAdr(chainGetCB(cb++));

   /* use the secondary clock */

   if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
   {
      p->info = NORMAL_DMA | TIMED_DMA(2);
      p->dst  = PCM_TIMER;
   }
   else
   {
      p->info = NORMAL_DMA | TIMED_DMA(5);
      p->dst  = PWM_TIMER;
   }

   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = BPD * 20 / PI_WF_MICROS; /* 20 micros delay */
   p->next   = waveCbPOadr(chainGetCB(cb));

   counters = 0;
   wid = -1;

   i = 0;

   while (i<bufSize)
   {
      wid = (unsigned)buf[i];

      if (wid == 255) /* wave command */
      {
         if ((i+2) > bufSize)
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "incomplete chain command (at %d)", i);

         cmd = buf[i+1];

         if (cmd == 0) /* loop begin */
         {
            if (stk_lev >= (sizeof(stk_pos)/sizeof(int)))
               SOFT_ERROR(PI_CHAIN_NESTING,
                  "chain counters nested too deep (at %d)", i);

            stk_pos[stk_lev++] = cb;

            i += 2;
         }
         else if (cmd == 1) /* loop end */
         {
            if (counters >= WCB_COUNTERS)
               SOFT_ERROR(PI_CHAIN_COUNTER,
                  "too many chain counters (at %d)", i);

            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_CYCLES)
               SOFT_ERROR(PI_CHAIN_LOOP_CNT,
                  "bad chain loop count (%d)", cycles);

            if (cycles == 0)
            {
               /* Skip the complete loop block.  Change
                  the next pointing to the start of the
                  loop block to the current cb.
               */
               p = rawWaveCBAdr(chainGetCB(loop));
               p->next = waveCbPOadr(chainGetCB(cb));
            }
            else if (cycles == 1)
            {
               /* Nothing to do, no need for a counter. */
            }
            else
            {
               chaincb = chainGetCB(cb++);
               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               p = rawWaveCBAdr(chaincb);

               repeat = waveCbPOadr(chainGetCB(loop));

                /* Need to check next cb as well. */

               chaincb = chainGetCB(cb);

               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               next = waveCbPOadr(chainGetCB(cb));

               /* dummy src and dest */
               p->info = NORMAL_DMA;
               p->src = (uint32_t) (&dmaOBus[0]->periphData);
               p->dst = (uint32_t) (&dmaOBus[0]->periphData);
               p->length = 4;
               p->next = waveCbPOadr(chainGetCntCB(counters));

               chainMakeCounter(counters, blklen, blocks,
                            cycles-1, repeat, next);

               counters++;
            }
         }
         else if (cmd == 2) /* delay us */
         {
            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_DELAY)
               SOFT_ERROR(PI_BAD_CHAIN_DELAY,
                  "bad chain delay micros (%d)", cycles);

            if (cycles)
            {
               delayLeft = cycles;
               delayCBs = waveDelayCBs(delayLeft);
               for (dcb=0; dcb<delayCBs; dcb++)
               {
                  chaincb = chainGetCB(cb++);

                  if (chaincb < 0)
                     SOFT_ERROR(
                        PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

                  p = rawWaveCBAdr(chaincb);

                  /* use the secondary clock */

                  if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(2);
                     p->dst  = PCM_TIMER;
                  }
                  else
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(5);
                     p->dst  = PWM_TIMER;
                  }

                  p->src = (uint32_t) (&dmaOBus[0]->periphData);

                  p->length = BPD * delayLeft / PI_WF_MICROS;

                  if ((gpioCfg.DMAsecondaryChannel >= DMA_LITE_FIRST) &&
                      (p->length > DMA_LITE_MAX))
                  {
                     p->length = DMA_LITE_MAX;
                  }

                  delayLeft -= (p->length / BPD);

                  p->next = waveCbPOadr(chainGetCB(cb));
               }
            }
         }
         else if (cmd == 3) /* repeat loop forever */
         {
            i += 2;

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            chaincb = chainGetCB(cb++);
            if (chaincb < 0)
               SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

            if (i < bufSize)
               SOFT_ERROR(PI_BAD_FOREVER,
                  "loop forever must be last command");

            p = rawWaveCBAdr(chaincb);

            /* dummy src and dest */
            p->info = NORMAL_DMA;
            p->src = (uint32_t) (&dmaOBus[0]->periphData);
            p->dst = (uint32_t) (&dmaOBus[0]->periphData);
            p->length = 4;
            p->next = waveCbPOadr(chainGetCB(loop));
            endPtr = &p->next;
         }
         else
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "unknown chain command (255 %d)", cmd);
      }
      else if ((wid >= waveOutCount) || waveInfo[wid].deleted)
         SOFT_ERROR(PI_BAD_WAVE_ID, "undefined wave (%d)", wid);
      else
      {
         chaincb = chainGetCB(cb++);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         p = rawWaveCBAdr(chaincb);

         chaincb = chainGetCB(cb);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         chainSetVal(cb-1, waveCbPOadr(chaincb));

         /* patch next of wid topCB to next cb */

         p->info   = NORMAL_DMA;
         p->src    = chainGetValPadr(cb-1); /* this next */
         p->dst    = waveCbPOadr(waveInfo[wid].topCB) + 20; /* wid next */
         p->length = 4;
         p->next   = waveCbPOadr(waveInfo[wid].botCB+1);

         i += 1;
      }
   }

   chaincb = chainGetCB(cb++);

   if (chaincb < 0)
      SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

   p = rawWaveCBAdr(chaincb);

   p->info   = NORMAL_DMA;
   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->dst    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = 4;
   p->next = 0;

   if (!endPtr) endPtr = &p->next;

   initDMAgo((uint32_t *)dmaOut, waveCbPOadr(chainGetCB(0)));

   waveEndPtr = endPtr;

   return 0;
}